

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O0

int __thiscall CppJieba::Trie::init(Trie *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  TrieNode *pTVar4;
  undefined8 extraout_RAX;
  bad_alloc *e;
  TrieNode *in_stack_ffffffffffffff90;
  char *local_60;
  allocator local_31;
  string local_30 [32];
  Trie *local_10;
  undefined1 local_1;
  
  local_10 = this;
  bVar1 = _getInitFlag(this);
  if (bVar1) {
    pcVar2 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                     ,0x2f);
    if (pcVar2 == (char *)0x0) {
      local_60 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp";
    }
    else {
      local_60 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/Trie.hpp"
                         ,0x2f);
      local_60 = local_60 + 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"already initted!",&local_31);
    Limonp::Logger::LoggingF(3,local_60,0x59,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    uVar3 = std::allocator<char>::~allocator((allocator<char> *)&local_31);
    local_1 = 0;
  }
  else {
    pTVar4 = (TrieNode *)operator_new(0x40);
    TrieNode::TrieNode(in_stack_ffffffffffffff90);
    this->_root = pTVar4;
    uVar3 = 0;
    if (this->_root == (TrieNode *)0x0) {
      local_1 = 0;
    }
    else {
      _setInitFlag(this,true);
      local_1 = 1;
      uVar3 = extraout_RAX;
    }
  }
  return (int)CONCAT71((int7)((ulong)uVar3 >> 8),local_1);
}

Assistant:

bool init()
            {
                if(_getInitFlag())
                {
                    LogError("already initted!");
                    return false;
                }

                try
                {
                    _root = new TrieNode;
                }
                catch(const bad_alloc& e)
                {
                    return false;
                }
                if(NULL == _root)
                {
                    return false;
                }
                _setInitFlag(true);
                return true;
            }